

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDescriptor.cpp
# Opt level: O0

void __thiscall Js::PropertyDescriptor::PropertyDescriptor(PropertyDescriptor *this)

{
  nullptr_t local_30;
  nullptr_t local_28;
  nullptr_t local_20;
  nullptr_t local_18;
  PropertyDescriptor *local_10;
  PropertyDescriptor *this_local;
  
  local_18 = (nullptr_t)0x0;
  local_10 = this;
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->Value,&local_18);
  local_20 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->Getter,&local_20);
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->Setter,&local_28);
  local_30 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->originalVar,&local_30);
  this->writableSpecified = false;
  this->enumerableSpecified = false;
  this->configurableSpecified = false;
  this->valueSpecified = false;
  this->getterSpecified = false;
  this->setterSpecified = false;
  this->Writable = false;
  this->Enumerable = false;
  this->Configurable = false;
  this->fromProxy = false;
  return;
}

Assistant:

PropertyDescriptor::PropertyDescriptor() :
        writableSpecified(false),
        enumerableSpecified(false),
        configurableSpecified(false),
        valueSpecified(false),
        getterSpecified(false),
        setterSpecified(false),
        Writable(false),
        Enumerable(false),
        Configurable(false),
        Value(nullptr),
        Getter(nullptr),
        Setter(nullptr),
        originalVar(nullptr),
        fromProxy(false)
    {
    }